

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::temp_dir(void)

{
  char *pcVar1;
  Path *in_RDI;
  string nstr;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_88,"TMPDIR",&local_89);
  utf8_to_filename(&local_28,&local_88);
  std::__cxx11::string::_M_dispose();
  pcVar1 = getenv(local_28._M_dataplus._M_p);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_68,"/tmp",(allocator *)&local_88);
    Path(in_RDI,&local_68);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)&local_88,pcVar1,&local_89);
    filename_to_utf8(&local_48,&local_88);
    Path(in_RDI,&local_48);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

Path Path::temp_dir()
{
#if defined(_PATHIE_UNIX)
  std::string nstr = utf8_to_filename("TMPDIR"); // environment is encoded the same as paths
  char* env_value = NULL;

  if ((env_value = getenv(nstr.c_str()))) // Single = intended
    return Path(filename_to_utf8(env_value));


  return Path("/tmp"); // As per the Filesystem Hierarchy Standard.
#elif defined(_WIN32)
  wchar_t buf[MAX_PATH +1]; // See http://msdn.microsoft.com/en-us/library/windows/desktop/aa364992%28v=vs.85%29.aspx for the +1
  DWORD count = GetTempPathW(MAX_PATH + 1, buf);

  if (count == 0) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

  std::wstring utf16(buf, count);
  return utf16_to_utf8(utf16);
#else
#error Unsupported system.
#endif
}